

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlutils.cpp
# Opt level: O0

bool QXmlUtils::isChar(char32_t c)

{
  bool local_6;
  bool local_5;
  char32_t c_local;
  
  if (((((uint)c < 0x20) || (local_5 = true, 0xd7ff < (uint)c)) && (local_5 = true, c != L'\t')) &&
     (((local_5 = true, c != L'\n' && (local_5 = true, c != L'\r')) &&
      (((uint)c < 0xe000 || (local_5 = true, 0xfffd < (uint)c)))))) {
    local_6 = 0xffff < (uint)c && (uint)c < 0x110000;
    local_5 = local_6;
  }
  return local_5;
}

Assistant:

bool QXmlUtils::isChar(const char32_t c)
{
    // The valid range is defined by https://www.w3.org/TR/REC-xml/#NT-Char as following:
    // Char ::= #x9 | #xA | #xD | [#x20-#xD7FF] | [#xE000-#xFFFD] | [#x10000-#x10FFFF]
    return (c >= 0x0020 && c <= 0xD7FF)
           || c == 0x0009
           || c == 0x000A
           || c == 0x000D
           || (c >= 0xE000 && c <= 0xFFFD)
           || (c >= 0x10000 && c <= 0x10FFFF);
}